

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O1

void __thiscall cdnsBlockTables::~cdnsBlockTables(cdnsBlockTables *this)

{
  pointer pcVar1;
  pointer pcVar2;
  pointer pcVar3;
  pointer pcVar4;
  
  pcVar1 = (this->rrs).super__Vector_base<cdns_rr_field,_std::allocator<cdns_rr_field>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar1 != (pointer)0x0) {
    operator_delete(pcVar1);
  }
  std::vector<cdns_rr_list,_std::allocator<cdns_rr_list>_>::~vector(&this->rr_list);
  pcVar2 = (this->qrr).super__Vector_base<cdns_question,_std::allocator<cdns_question>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar2 != (pointer)0x0) {
    operator_delete(pcVar2);
  }
  std::vector<cdns_question_list,_std::allocator<cdns_question_list>_>::~vector
            (&this->question_list);
  pcVar3 = (this->q_sigs).
           super__Vector_base<cdns_query_signature,_std::allocator<cdns_query_signature>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar3 != (pointer)0x0) {
    operator_delete(pcVar3);
  }
  std::vector<cbor_bytes,_std::allocator<cbor_bytes>_>::~vector(&this->name_rdata);
  pcVar4 = (this->class_ids).super__Vector_base<cdns_class_id,_std::allocator<cdns_class_id>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pcVar4 != (pointer)0x0) {
    operator_delete(pcVar4);
  }
  std::vector<cbor_bytes,_std::allocator<cbor_bytes>_>::~vector(&this->addresses);
  return;
}

Assistant:

cdnsBlockTables::~cdnsBlockTables()
{
}